

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O0

void pass2_fs_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  ushort *puVar15;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  LOCFSERROR bnexterr;
  int pixcode;
  JSAMPROW colormap2;
  JSAMPROW colormap1;
  JSAMPROW colormap0;
  int *error_limit;
  JSAMPLE *range_limit;
  JDIMENSION width;
  JDIMENSION col;
  int row;
  int dir3;
  int dir;
  histptr cachep;
  JSAMPROW outptr;
  JSAMPROW inptr;
  FSERRPTR errorptr;
  LOCFSERROR bpreverr2;
  LOCFSERROR bpreverr1;
  LOCFSERROR bpreverr0;
  LOCFSERROR belowerr2;
  LOCFSERROR belowerr1;
  LOCFSERROR belowerr0;
  LOCFSERROR cur2;
  LOCFSERROR cur1;
  LOCFSERROR cur0;
  hist3d histogram;
  my_cquantize_ptr_conflict cquantize;
  int in_stack_00000114;
  int in_stack_00000118;
  int in_stack_0000011c;
  j_decompress_ptr in_stack_00000120;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  undefined1 *local_70;
  byte *local_68;
  short *local_60;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  lVar2 = *(long *)(in_RDI + 0x270);
  lVar3 = *(long *)(lVar2 + 0x30);
  iVar1 = *(int *)(in_RDI + 0x88);
  lVar4 = *(long *)(in_RDI + 0x1a8);
  lVar5 = *(long *)(lVar2 + 0x50);
  lVar6 = **(long **)(in_RDI + 0xa0);
  lVar7 = *(long *)(*(long *)(in_RDI + 0xa0) + 8);
  lVar8 = *(long *)(*(long *)(in_RDI + 0xa0) + 0x10);
  for (local_84 = 0; local_84 < in_ECX; local_84 = local_84 + 1) {
    local_68 = *(byte **)(in_RSI + (long)local_84 * 8);
    local_70 = *(undefined1 **)(in_RDX + (long)local_84 * 8);
    if (*(int *)(lVar2 + 0x48) == 0) {
      local_7c = 1;
      local_80 = 3;
      local_60 = *(short **)(lVar2 + 0x40);
      *(undefined4 *)(lVar2 + 0x48) = 1;
    }
    else {
      local_68 = local_68 + (uint)((iVar1 + -1) * 3);
      local_70 = local_70 + (iVar1 - 1);
      local_7c = -1;
      local_80 = -3;
      local_60 = (short *)(*(long *)(lVar2 + 0x40) + (ulong)(uint)((iVar1 + 1) * 3) * 2);
      *(undefined4 *)(lVar2 + 0x48) = 0;
    }
    local_3c = 0;
    local_38 = 0;
    local_34 = 0;
    local_48 = 0;
    local_44 = 0;
    local_40 = 0;
    local_54 = 0;
    local_50 = 0;
    local_4c = 0;
    for (local_88 = iVar1; local_88 != 0; local_88 = local_88 + -1) {
      uVar9 = (uint)*(byte *)(lVar4 + (int)((uint)*local_68 +
                                           *(int *)(lVar5 + (long)(local_34 + local_60[local_80] + 8
                                                                  >> 4) * 4)));
      uVar10 = (uint)*(byte *)(lVar4 + (int)((uint)local_68[1] +
                                            *(int *)(lVar5 + (long)(local_38 +
                                                                    local_60[local_80 + 1] + 8 >> 4)
                                                             * 4)));
      uVar11 = (uint)*(byte *)(lVar4 + (int)((uint)local_68[2] +
                                            *(int *)(lVar5 + (long)(local_3c +
                                                                    local_60[local_80 + 2] + 8 >> 4)
                                                             * 4)));
      puVar15 = (ushort *)
                (*(long *)(lVar3 + (long)((int)uVar9 >> 3) * 8) + (long)((int)uVar10 >> 2) * 0x40 +
                (long)((int)uVar11 >> 3) * 2);
      if (*puVar15 == 0) {
        fill_inverse_cmap(in_stack_00000120,in_stack_0000011c,in_stack_00000118,in_stack_00000114);
      }
      iVar12 = *puVar15 - 1;
      *local_70 = (char)iVar12;
      iVar13 = uVar9 - *(byte *)(lVar6 + iVar12);
      iVar14 = uVar10 - *(byte *)(lVar7 + iVar12);
      iVar12 = uVar11 - *(byte *)(lVar8 + iVar12);
      *local_60 = (short)local_4c + (short)iVar13 * 3;
      local_4c = local_40 + iVar13 * 5;
      local_34 = iVar13 * 7;
      local_60[1] = (short)local_50 + (short)iVar14 * 3;
      local_50 = local_44 + iVar14 * 5;
      local_38 = iVar14 * 7;
      local_60[2] = (short)local_54 + (short)iVar12 * 3;
      local_54 = local_48 + iVar12 * 5;
      local_3c = iVar12 * 7;
      local_68 = local_68 + local_80;
      local_70 = local_70 + local_7c;
      local_60 = local_60 + local_80;
      local_48 = iVar12;
      local_44 = iVar14;
      local_40 = iVar13;
    }
    *local_60 = (short)local_4c;
    local_60[1] = (short)local_50;
    local_60[2] = (short)local_54;
  }
  return;
}

Assistant:

METHODDEF(void)
pass2_fs_dither(j_decompress_ptr cinfo, JSAMPARRAY input_buf,
                JSAMPARRAY output_buf, int num_rows)
/* This version performs Floyd-Steinberg dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr)cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  register LOCFSERROR cur0, cur1, cur2; /* current error or pixel value */
  LOCFSERROR belowerr0, belowerr1, belowerr2; /* error for pixel below cur */
  LOCFSERROR bpreverr0, bpreverr1, bpreverr2; /* error for below/prev col */
  register FSERRPTR errorptr;   /* => fserrors[] at column before current */
  JSAMPROW inptr;               /* => current input pixel */
  JSAMPROW outptr;              /* => current output pixel */
  histptr cachep;
  int dir;                      /* +1 or -1 depending on direction */
  int dir3;                     /* 3*dir, for advancing inptr & errorptr */
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;
  JSAMPLE *range_limit = cinfo->sample_range_limit;
  int *error_limit = cquantize->error_limiter;
  JSAMPROW colormap0 = cinfo->colormap[0];
  JSAMPROW colormap1 = cinfo->colormap[1];
  JSAMPROW colormap2 = cinfo->colormap[2];
  SHIFT_TEMPS

  for (row = 0; row < num_rows; row++) {
    inptr = input_buf[row];
    outptr = output_buf[row];
    if (cquantize->on_odd_row) {
      /* work right to left in this row */
      inptr += (width - 1) * 3; /* so point to rightmost pixel */
      outptr += width - 1;
      dir = -1;
      dir3 = -3;
      errorptr = cquantize->fserrors + (width + 1) * 3; /* => entry after last column */
      cquantize->on_odd_row = FALSE; /* flip for next time */
    } else {
      /* work left to right in this row */
      dir = 1;
      dir3 = 3;
      errorptr = cquantize->fserrors; /* => entry before first real column */
      cquantize->on_odd_row = TRUE; /* flip for next time */
    }
    /* Preset error values: no error propagated to first pixel from left */
    cur0 = cur1 = cur2 = 0;
    /* and no error propagated to row below yet */
    belowerr0 = belowerr1 = belowerr2 = 0;
    bpreverr0 = bpreverr1 = bpreverr2 = 0;

    for (col = width; col > 0; col--) {
      /* curN holds the error propagated from the previous pixel on the
       * current line.  Add the error propagated from the previous line
       * to form the complete error correction term for this pixel, and
       * round the error term (which is expressed * 16) to an integer.
       * RIGHT_SHIFT rounds towards minus infinity, so adding 8 is correct
       * for either sign of the error value.
       * Note: errorptr points to *previous* column's array entry.
       */
      cur0 = RIGHT_SHIFT(cur0 + errorptr[dir3 + 0] + 8, 4);
      cur1 = RIGHT_SHIFT(cur1 + errorptr[dir3 + 1] + 8, 4);
      cur2 = RIGHT_SHIFT(cur2 + errorptr[dir3 + 2] + 8, 4);
      /* Limit the error using transfer function set by init_error_limit.
       * See comments with init_error_limit for rationale.
       */
      cur0 = error_limit[cur0];
      cur1 = error_limit[cur1];
      cur2 = error_limit[cur2];
      /* Form pixel value + error, and range-limit to 0..MAXJSAMPLE.
       * The maximum error is +- MAXJSAMPLE (or less with error limiting);
       * this sets the required size of the range_limit array.
       */
      cur0 += inptr[0];
      cur1 += inptr[1];
      cur2 += inptr[2];
      cur0 = range_limit[cur0];
      cur1 = range_limit[cur1];
      cur2 = range_limit[cur2];
      /* Index into the cache with adjusted pixel value */
      cachep =
        &histogram[cur0 >> C0_SHIFT][cur1 >> C1_SHIFT][cur2 >> C2_SHIFT];
      /* If we have not seen this color before, find nearest colormap */
      /* entry and update the cache */
      if (*cachep == 0)
        fill_inverse_cmap(cinfo, cur0 >> C0_SHIFT, cur1 >> C1_SHIFT,
                          cur2 >> C2_SHIFT);
      /* Now emit the colormap index for this cell */
      {
        register int pixcode = *cachep - 1;
        *outptr = (JSAMPLE)pixcode;
        /* Compute representation error for this pixel */
        cur0 -= colormap0[pixcode];
        cur1 -= colormap1[pixcode];
        cur2 -= colormap2[pixcode];
      }
      /* Compute error fractions to be propagated to adjacent pixels.
       * Add these into the running sums, and simultaneously shift the
       * next-line error sums left by 1 column.
       */
      {
        register LOCFSERROR bnexterr;

        bnexterr = cur0;        /* Process component 0 */
        errorptr[0] = (FSERROR)(bpreverr0 + cur0 * 3);
        bpreverr0 = belowerr0 + cur0 * 5;
        belowerr0 = bnexterr;
        cur0 *= 7;
        bnexterr = cur1;        /* Process component 1 */
        errorptr[1] = (FSERROR)(bpreverr1 + cur1 * 3);
        bpreverr1 = belowerr1 + cur1 * 5;
        belowerr1 = bnexterr;
        cur1 *= 7;
        bnexterr = cur2;        /* Process component 2 */
        errorptr[2] = (FSERROR)(bpreverr2 + cur2 * 3);
        bpreverr2 = belowerr2 + cur2 * 5;
        belowerr2 = bnexterr;
        cur2 *= 7;
      }
      /* At this point curN contains the 7/16 error value to be propagated
       * to the next pixel on the current line, and all the errors for the
       * next line have been shifted over.  We are therefore ready to move on.
       */
      inptr += dir3;            /* Advance pixel pointers to next column */
      outptr += dir;
      errorptr += dir3;         /* advance errorptr to current column */
    }
    /* Post-loop cleanup: we must unload the final error values into the
     * final fserrors[] entry.  Note we need not unload belowerrN because
     * it is for the dummy column before or after the actual array.
     */
    errorptr[0] = (FSERROR)bpreverr0; /* unload prev errs into array */
    errorptr[1] = (FSERROR)bpreverr1;
    errorptr[2] = (FSERROR)bpreverr2;
  }
}